

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

MOJOSHADER_glEffect * MOJOSHADER_glCompileEffect(MOJOSHADER_effect *effect)

{
  int iVar1;
  MOJOSHADER_effect *__s;
  MOJOSHADER_effectObject *pMVar2;
  char *pcVar3;
  undefined8 uVar4;
  MOJOSHADER_effectObject *object_1;
  MOJOSHADER_effectObject *object;
  MOJOSHADER_glEffect *retval;
  int local_40;
  GLuint shader;
  int current_preshader;
  int current_shader;
  void *d;
  MOJOSHADER_free f;
  MOJOSHADER_malloc m;
  MOJOSHADER_effect *pMStack_18;
  int i;
  MOJOSHADER_effect *effect_local;
  
  f = (MOJOSHADER_free)effect->malloc;
  d = effect->free;
  _current_preshader = effect->malloc_data;
  shader = 0;
  local_40 = 0;
  retval._4_4_ = 0;
  pMStack_18 = effect;
  __s = (MOJOSHADER_effect *)(*f)((void *)0x58,_current_preshader);
  if (__s == (MOJOSHADER_effect *)0x0) {
    out_of_memory();
    effect_local = (MOJOSHADER_effect *)0x0;
  }
  else {
    memset(__s,0,0x58);
    for (m._4_4_ = 0; (int)m._4_4_ < pMStack_18->object_count; m._4_4_ = m._4_4_ + 1) {
      pMVar2 = pMStack_18->objects + (int)m._4_4_;
      if ((pMVar2->type == MOJOSHADER_SYMTYPE_PIXELSHADER) ||
         (pMVar2->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)) {
        if (*(int *)((long)pMVar2 + 0xc) == 0) {
          *(int *)&__s->errors = *(int *)&__s->errors + 1;
        }
        else {
          *(int *)&__s->params = *(int *)&__s->params + 1;
        }
      }
    }
    pcVar3 = (char *)(*f)((void *)(ulong)(uint)(*(int *)&__s->errors << 4),_current_preshader);
    __s->profile = pcVar3;
    if (__s->profile == (char *)0x0) {
      (*(code *)d)(__s,_current_preshader);
      out_of_memory();
      effect_local = (MOJOSHADER_effect *)0x0;
    }
    else {
      memset(__s->profile,0,(ulong)*(uint *)&__s->errors << 4);
      uVar4 = (*f)((void *)(ulong)(uint)(*(int *)&__s->errors << 2),_current_preshader);
      *(undefined8 *)&__s->param_count = uVar4;
      if (*(long *)&__s->param_count == 0) {
        (*(code *)d)(__s->profile,_current_preshader);
        (*(code *)d)(__s,_current_preshader);
        out_of_memory();
        effect_local = (MOJOSHADER_effect *)0x0;
      }
      else {
        memset(*(void **)&__s->param_count,0,(ulong)*(uint *)&__s->errors << 2);
        if (*(int *)&__s->params != 0) {
          uVar4 = (*f)((void *)(ulong)(uint)(*(int *)&__s->params << 2),_current_preshader);
          *(undefined8 *)&__s->technique_count = uVar4;
          if (*(long *)&__s->technique_count == 0) {
            (*(code *)d)(__s->profile,_current_preshader);
            (*(code *)d)(*(undefined8 *)&__s->param_count,_current_preshader);
            (*(code *)d)(__s,_current_preshader);
            out_of_memory();
            return (MOJOSHADER_glEffect *)0x0;
          }
          memset(*(void **)&__s->technique_count,0,(ulong)*(uint *)&__s->params << 2);
        }
        for (m._4_4_ = 0; (int)m._4_4_ < pMStack_18->object_count; m._4_4_ = m._4_4_ + 1) {
          pMVar2 = pMStack_18->objects + (int)m._4_4_;
          if ((pMVar2->type == MOJOSHADER_SYMTYPE_PIXELSHADER) ||
             (pMVar2->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)) {
            if (*(int *)((long)pMVar2 + 0xc) == 0) {
              iVar1 = (*ctx->profileCompileShader)
                                (*(MOJOSHADER_parseData **)((long)pMVar2 + 0x40),
                                 (GLuint *)((long)&retval + 4));
              if (iVar1 == 0) {
                for (m._4_4_ = 0; m._4_4_ < *(uint *)&__s->errors; m._4_4_ = m._4_4_ + 1) {
                  if (*(int *)(__s->profile + (long)(int)m._4_4_ * 0x10 + 8) != 0) {
                    (*ctx->profileDeleteShader)
                              (*(GLuint *)(__s->profile + (long)(int)m._4_4_ * 0x10 + 8));
                  }
                }
                (*(code *)d)(*(undefined8 *)&__s->param_count,_current_preshader);
                (*(code *)d)(__s->profile,_current_preshader);
                (*(code *)d)(__s,_current_preshader);
                return (MOJOSHADER_glEffect *)0x0;
              }
              *(undefined8 *)(__s->profile + (long)(int)shader * 0x10) =
                   *(undefined8 *)((long)pMVar2 + 0x40);
              *(undefined4 *)(__s->profile + (long)(int)shader * 0x10 + 8) = retval._4_4_;
              pcVar3 = __s->profile + (long)(int)shader * 0x10 + 0xc;
              pcVar3[0] = '\x01';
              pcVar3[1] = '\0';
              pcVar3[2] = '\0';
              pcVar3[3] = '\0';
              *(uint *)(*(long *)&__s->param_count + (long)(int)shader * 4) = m._4_4_;
              shader = shader + 1;
            }
            else {
              *(uint *)(*(long *)&__s->technique_count + (long)local_40 * 4) = m._4_4_;
              local_40 = local_40 + 1;
            }
          }
        }
        *(MOJOSHADER_effect **)__s = pMStack_18;
        effect_local = __s;
      }
    }
  }
  return (MOJOSHADER_glEffect *)effect_local;
}

Assistant:

MOJOSHADER_glEffect *MOJOSHADER_glCompileEffect(MOJOSHADER_effect *effect)
{
    int i;
    MOJOSHADER_malloc m = effect->malloc;
    MOJOSHADER_free f = effect->free;
    void *d = effect->malloc_data;
    int current_shader = 0;
    int current_preshader = 0;
    GLuint shader = 0;

    MOJOSHADER_glEffect *retval = (MOJOSHADER_glEffect *) m(sizeof (MOJOSHADER_glEffect), d);
    if (retval == NULL)
    {
        out_of_memory();
        return NULL;
    } // if
    memset(retval, '\0', sizeof (MOJOSHADER_glEffect));

    // Count the number of shaders before allocating
    for (i = 0; i < effect->object_count; i++)
    {
        MOJOSHADER_effectObject *object = &effect->objects[i];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            if (object->shader.is_preshader)
                retval->num_preshaders++;
            else
                retval->num_shaders++;
        } // if
    } // for

    // Alloc shader information
    retval->shaders = (MOJOSHADER_glShader *) m(retval->num_shaders * sizeof (MOJOSHADER_glShader), d);
    if (retval->shaders == NULL)
    {
        f(retval, d);
        out_of_memory();
        return NULL;
    } // if
    memset(retval->shaders, '\0', retval->num_shaders * sizeof (MOJOSHADER_glShader));
    retval->shader_indices = (unsigned int *) m(retval->num_shaders * sizeof (unsigned int), d);
    if (retval->shader_indices == NULL)
    {
        f(retval->shaders, d);
        f(retval, d);
        out_of_memory();
        return NULL;
    } // if
    memset(retval->shader_indices, '\0', retval->num_shaders * sizeof (unsigned int));

    // Alloc preshader information
    if (retval->num_preshaders > 0)
    {
        retval->preshader_indices = (unsigned int *) m(retval->num_preshaders * sizeof (unsigned int), d);
        if (retval->preshader_indices == NULL)
        {
            f(retval->shaders, d);
            f(retval->shader_indices, d);
            f(retval, d);
            out_of_memory();
            return NULL;
        } // if
        memset(retval->preshader_indices, '\0', retval->num_preshaders * sizeof (unsigned int));
    } // if

    // Run through the shaders again, compiling and tracking the object indices
    for (i = 0; i < effect->object_count; i++)
    {
        MOJOSHADER_effectObject *object = &effect->objects[i];
        if (object->type == MOJOSHADER_SYMTYPE_PIXELSHADER
         || object->type == MOJOSHADER_SYMTYPE_VERTEXSHADER)
        {
            if (object->shader.is_preshader)
            {
                retval->preshader_indices[current_preshader++] = i;
                continue;
            } // if
            if (!ctx->profileCompileShader(object->shader.shader, &shader))
                goto compile_shader_fail;
            retval->shaders[current_shader].parseData = object->shader.shader;
            retval->shaders[current_shader].handle = shader;
            retval->shaders[current_shader].refcount = 1;
            retval->shader_indices[current_shader] = i;
            current_shader++;
        } // if
    } // for

    retval->effect = effect;
    return retval;

compile_shader_fail:
    for (i = 0; i < retval->num_shaders; i++)
        if (retval->shaders[i].handle != 0)
            ctx->profileDeleteShader(retval->shaders[i].handle);
    f(retval->shader_indices, d);
    f(retval->shaders, d);
    f(retval, d);
    return NULL;
}